

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::up_down_position(Fl_Input_ *this,int i,int keepmark)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  double dVar4;
  int local_46c;
  int j;
  int f;
  char *t;
  char *r;
  char *l;
  char *e;
  char *p;
  char buf [1024];
  int keepmark_local;
  int i_local;
  Fl_Input_ *this_local;
  
  buf._1016_4_ = keepmark;
  buf._1020_4_ = i;
  setfont(this);
  pcVar2 = value(this);
  pcVar2 = pcVar2 + (int)buf._1020_4_;
  t = expand(this,pcVar2,(char *)&p);
  pcVar3 = pcVar2;
  while (r = pcVar3, r < t) {
    pcVar3 = r + (long)(t + (1 - (long)r)) / 2;
    dVar4 = expandpos(this,pcVar2,pcVar3,(char *)&p,(int *)0x0);
    if (up_down_pos < (double)(int)dVar4) {
      t = pcVar3 + -1;
      pcVar3 = r;
    }
  }
  pcVar3 = value(this);
  iVar1 = (int)r - (int)pcVar3;
  local_46c = iVar1;
  if (buf._1016_4_ != 0) {
    local_46c = this->mark_;
  }
  iVar1 = position(this,iVar1,local_46c);
  was_up_down = 1;
  return iVar1;
}

Assistant:

int Fl_Input_::up_down_position(int i, int keepmark) {
  // unlike before, i must be at the start of the line already!

  setfont();
  char buf[MAXBUF];
  const char* p = value()+i;
  const char* e = expand(p, buf);
  const char *l, *r, *t;
  for (l = p, r = e; l<r; ) {
    t = l+(r-l+1)/2;
    int f = (int)expandpos(p, t, buf, 0);
    if (f <= up_down_pos) l = t; else r = t-1;
  }
  int j = (int) (l-value());
  j = position(j, keepmark ? mark_ : j);
  was_up_down = 1;
  return j;
}